

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

parser_error parse_renderer_name(parser *p)

{
  renderer_info *prVar1;
  renderer_info *prVar2;
  wchar_t wVar3;
  char *pcVar4;
  renderer_info *v;
  bool bVar5;
  
  pcVar4 = parser_getstr(p,"name");
  wVar3 = ui_entry_renderer_lookup(pcVar4);
  if (wVar3 == L'\0') {
    wVar3 = renderer_count;
    if (renderer_allocated <= renderer_count) {
      if (L'\x3fffffff' < renderer_allocated) {
        return PARSE_ERROR_TOO_MANY_ENTRIES;
      }
      wVar3 = renderer_allocated * 2;
      bVar5 = renderer_allocated != L'\0';
      renderer_allocated = L'\x04';
      if (bVar5) {
        renderer_allocated = wVar3;
      }
      renderers = (renderer_info *)mem_realloc(renderers,(long)renderer_allocated * 0x58);
      wVar3 = renderer_count;
    }
    prVar2 = renderers;
    v = renderers + wVar3;
    renderer_count = wVar3 + L'\x01';
    pcVar4 = string_make(pcVar4);
    prVar2[wVar3].name = pcVar4;
    prVar2[wVar3].comb_rend_nm = (char *)0x0;
    (&prVar2[wVar3].comb_rend_nm)[1] = (char *)0x0;
    prVar2[wVar3].label_colors = (int *)0x0;
    (&prVar2[wVar3].label_colors)[1] = (wchar_t *)0x0;
    prVar2[wVar3].units_label = (wchar_t *)0x0;
    (&prVar2[wVar3].units_label)[1] = (wchar_t *)0x0;
    prVar1 = prVar2 + wVar3;
    prVar1->combined_renderer_index = L'\0';
    prVar1->combiner_index = L'\0';
    *(undefined8 *)(&prVar1->combined_renderer_index + 2) = 0;
    prVar2[wVar3].nsym = L'\0';
    prVar2[wVar3].ndigit = L'\x80000000';
    prVar2[wVar3].sign = L'\x80000000';
    prVar2[wVar3].units_nlabel = L'\0';
  }
  else {
    v = renderers + (long)wVar3 + -1;
  }
  parser_setpriv(p,v);
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_renderer_name(struct parser *p)
{
	const char *name = parser_getstr(p, "name");
	int ind = ui_entry_renderer_lookup(name);
	struct renderer_info *renderer;

	if (ind == 0) {
		if (renderer_count >= renderer_allocated) {
			if (renderer_allocated > INT_MAX / 2) {
				return PARSE_ERROR_TOO_MANY_ENTRIES;
			}
			renderer_allocated = (renderer_allocated == 0) ?
				4 : renderer_allocated * 2;
			renderers = mem_realloc(renderers,
				renderer_allocated * sizeof(*renderers));
		}
		renderer = renderers + renderer_count;
		++renderer_count;
		renderer->name = string_make(name);
		renderer->comb_rend_nm = NULL;
		renderer->colors = NULL;
		renderer->label_colors = NULL;
		renderer->symbols = NULL;
		renderer->units_label = NULL;
		renderer->backend = NULL;
		renderer->combined_renderer_index = 0;
		renderer->combiner_index = 0;
		renderer->ncolors = 0;
		renderer->nlabcolors = 0;
		renderer->nsym = 0;
		renderer->ndigit = INT_MIN;
		renderer->sign = UI_ENTRY_SIGN_DEFAULT;
		renderer->units_nlabel = 0;
	} else {
		renderer = renderers + ind - 1;
	}
	parser_setpriv(p, renderer);
	return PARSE_ERROR_NONE;
}